

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O3

void __thiscall
VPLGrammar::Parser::OrExpressionNode::BuildProgram(OrExpressionNode *this,Scope *scope,ostream *out)

{
  __uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_> _Var1;
  ostream *poVar2;
  int iVar3;
  ulong uVar4;
  
  (**(code **)(*(long *)(((this->super_ASTNodeBasic).children_.
                          super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                        ._M_t + 0x28))();
  if ((long)(this->super_ASTNodeBasic).children_.
            super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->super_ASTNodeBasic).children_.
            super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"    bool\n",9);
  iVar3 = scope->unique_id_ + 1;
  scope->unique_id_ = iVar3;
  if (8 < (ulong)((long)(this->super_ASTNodeBasic).children_.
                        super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->super_ASTNodeBasic).children_.
                       super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    uVar4 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"    jnz .L",10);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_end\n",5);
      _Var1._M_t.
      super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
      .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl =
           (this->super_ASTNodeBasic).children_.
           super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
           super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ._M_t;
      (**(code **)(*(long *)_Var1._M_t.
                            super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                            .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl +
                  0x28))(_Var1._M_t.
                         super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                         .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl,
                         scope,out);
      std::__ostream_insert<char,std::char_traits<char>>(out,"    bool\n",9);
      std::__ostream_insert<char,std::char_traits<char>>(out,"    or\n",7);
      scope->cur_stack_pos_ = scope->cur_stack_pos_ + -1;
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(this->super_ASTNodeBasic).children_.
                                   super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->super_ASTNodeBasic).children_.
                                   super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"func .L",7);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_end\n",5);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                if (children_.size() == 1) {
                    return;
                }
                out << "    bool\n";
                int unique_id = scope->GetUnique();
                for (size_t i = 1; i < children_.size(); ++i) {
                    out << "    jnz .L" << unique_id << "_end\n";
                    children_[i]->BuildProgram(scope, out);
                    out << "    bool\n";
                    out << "    or\n";
                    scope->Pop();
                }
                out << "func .L" << unique_id << "_end\n";
            }